

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

MemoryRegion_conflict * memory_region_get_flatview_root(MemoryRegion_conflict *mr)

{
  long *plVar1;
  MemoryRegion *pMVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  char cVar6;
  MemoryRegion *pMVar7;
  MemoryRegion_conflict *pMVar8;
  char cVar9;
  anon_union_16_2_aaf24f3d_for_subregions_link *paVar10;
  char cVar11;
  
  do {
    if (mr->enabled != true) goto LAB_00b130cc;
    if (mr->terminates != false) {
      return mr;
    }
    paVar10 = (anon_union_16_2_aaf24f3d_for_subregions_link *)&mr->subregions;
    pMVar7 = (MemoryRegion *)0x0;
    cVar11 = '\0';
    while( true ) {
      pMVar2 = paVar10->tqe_next;
      cVar6 = '\x01';
      if (pMVar2 == (MemoryRegion *)0x0) break;
      if (pMVar2->enabled == true) {
        if (cVar11 != '\0') {
          pMVar7 = (MemoryRegion *)0x0;
          cVar11 = '\x02';
          break;
        }
        cVar11 = cVar6;
        if ((pMVar2->addr == 0) &&
           (lVar3 = *(long *)((long)&mr->size + 8), plVar1 = (long *)((long)&pMVar2->size + 8),
           uVar4 = (ulong)((ulong)mr->size < (ulong)pMVar2->size), lVar5 = lVar3 - *plVar1,
           (SBORROW8(lVar3,*plVar1) != SBORROW8(lVar5,uVar4)) == (long)(lVar5 - uVar4) < 0)) {
          pMVar7 = pMVar2;
        }
      }
      paVar10 = &pMVar2->subregions_link;
    }
    pMVar8 = (MemoryRegion_conflict *)pMVar7;
    if (pMVar7 == (MemoryRegion *)0x0) {
      pMVar8 = mr;
    }
    cVar9 = (pMVar7 != (MemoryRegion *)0x0) * '\x02';
    if (cVar11 == '\0') {
      pMVar8 = mr;
      cVar9 = cVar6;
    }
    mr = pMVar8;
  } while (cVar9 == '\x02');
  if (cVar9 != '\0') {
LAB_00b130cc:
    mr = (MemoryRegion_conflict *)0x0;
  }
  return mr;
}

Assistant:

static MemoryRegion *memory_region_get_flatview_root(MemoryRegion *mr)
{
    while (mr->enabled) {
        if (!mr->terminates) {
            unsigned int found = 0;
            MemoryRegion *child, *next = NULL;
            QTAILQ_FOREACH(child, &mr->subregions, subregions_link) {
                if (child->enabled) {
                    if (++found > 1) {
                        next = NULL;
                        break;
                    }
                    if (!child->addr && int128_ge(mr->size, child->size)) {
                        /* A child is included in its entirety.  If it's the only
                         * enabled one, use it in the hope of finding an alias down the
                         * way. This will also let us share FlatViews.
                         */
                        next = child;
                    }
                }
            }
            if (found == 0) {
                return NULL;
            }
            if (next) {
                mr = next;
                continue;
            }
        }

        return mr;
    }

    return NULL;
}